

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

reference __thiscall
QVLABase<QWizard::WizardButton>::emplace_back_impl<QWizard::WizardButton>
          (QVLABase<QWizard::WizardButton> *this,qsizetype prealloc,void *array,WizardButton *args)

{
  QVLABase<QWizard::WizardButton> *this_00;
  QVLABase<QWizard::WizardButton> *pQVar1;
  iterator ptr;
  WizardButton *pWVar2;
  WizardButton *in_RCX;
  void *in_RDX;
  qsizetype in_RSI;
  QVLABaseBase *in_RDI;
  reference r;
  QVLABaseBase *this_01;
  
  this_01 = in_RDI;
  this_00 = (QVLABase<QWizard::WizardButton> *)QVLABaseBase::size(in_RDI);
  pQVar1 = (QVLABase<QWizard::WizardButton> *)QVLABaseBase::capacity(in_RDI);
  if (this_00 == pQVar1) {
    growBy((QVLABase<QWizard::WizardButton> *)this_01,in_RSI,in_RDX,(qsizetype)in_RCX);
  }
  ptr = end(this_00);
  pWVar2 = q20::construct_at<QWizard::WizardButton,QWizard::WizardButton,void>(ptr,in_RCX);
  in_RDI->s = in_RDI->s + 1;
  return pWVar2;
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }